

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O3

int sys_parsedevlist(int *np,int *vecp,int max,char *str)

{
  char *in_RAX;
  long lVar1;
  ulong uVar2;
  char *endp;
  char *local_38;
  
  if (max < 1) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    local_38 = in_RAX;
    do {
      if (*str == '\0') goto LAB_00176021;
      lVar1 = strtol(str,&local_38,10);
      vecp[uVar2] = (int)lVar1;
      if (local_38 == str) goto LAB_00176021;
      if (*local_38 == '\0') {
        uVar2 = uVar2 + 1;
        goto LAB_00176021;
      }
      uVar2 = uVar2 + 1;
      str = local_38 + 1;
    } while ((uint)max != uVar2);
    uVar2 = (ulong)(uint)max;
  }
LAB_00176021:
  *np = (int)uVar2;
  return (int)uVar2;
}

Assistant:

static int sys_parsedevlist(int *np, int *vecp, int max, const char *str)
{
    int n = 0;
    while (n < max)
    {
        if (! *str) break;
        else
        {
            char *endp;
            vecp[n] = (int)strtol(str, &endp, 10);
            if (endp == str)
                break;
            n++;
            if (! *endp)
                break;
            str = endp + 1;
        }
    }
    return (*np = n);
}